

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<vkb::Device> * __thiscall
vkb::DeviceBuilder::build(Result<vkb::Device> *__return_storage_ptr__,DeviceBuilder *this)

{
  VkPhysicalDeviceFeatures *__src;
  pointer pbVar1;
  value_type *ppVVar2;
  VkBaseOutStructure *pVVar3;
  pointer pCVar4;
  pointer ppVVar5;
  VkPhysicalDeviceFeatures *pVVar6;
  VkResult VVar7;
  pointer ppVVar8;
  pointer ppVVar9;
  VkBaseOutStructure **pnext_1;
  value_type *__x;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *__range1;
  CustomQueueDescription *desc;
  pointer pCVar10;
  pointer pbVar11;
  VkBaseOutStructure **pnext;
  initializer_list<float> __l;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> final_pnext_chain;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
  queue_descriptions;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_enable;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queueCreateInfos;
  GenericFeatureChain physical_device_extension_features_copy;
  VkDeviceCreateInfo device_create_info;
  VkPhysicalDeviceFeatures2 local_features2;
  Device device;
  
  queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
  insert<__gnu_cxx::__normal_iterator<vkb::CustomQueueDescription_const*,std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>>,void>
            ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>> *)
             &queue_descriptions,(const_iterator)0x0,
             (this->info).queue_descriptions.
             super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->info).queue_descriptions.
             super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (queue_descriptions.
      super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      queue_descriptions.
      super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    for (local_features2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        (ulong)local_features2.sType <
        (ulong)(((long)(this->physical_device).queue_families.
                       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->physical_device).queue_families.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        local_features2.sType = local_features2.sType + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
      device_create_info.sType = 0x3f800000;
      __l._M_len = 1;
      __l._M_array = (iterator)&device_create_info;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&device,__l,
                 (allocator_type *)&queueCreateInfos);
      std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
      emplace_back<unsigned_int&,std::vector<float,std::allocator<float>>>
                ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>> *)
                 &queue_descriptions,&local_features2.sType,
                 (vector<float,_std::allocator<float>_> *)&device);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&device);
    }
  }
  pCVar4 = queue_descriptions.
           super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  queueCreateInfos.
  super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  queueCreateInfos.
  super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  queueCreateInfos.
  super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pCVar10 = queue_descriptions.
                 super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar4; pCVar10 = pCVar10 + 1
      ) {
    device.physical_device.name._M_dataplus._M_p = (pointer)0x0;
    device.device = (VkDevice)0x2;
    device.physical_device.name._M_string_length = (ulong)pCVar10->index << 0x20;
    device.physical_device.name.field_2._8_8_ =
         (pCVar10->priorities).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    device.physical_device.name.field_2._M_allocated_capacity =
         (ulong)((long)(pCVar10->priorities).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                device.physical_device.name.field_2._8_8_) >> 2 & 0xffffffff;
    std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::push_back
              (&queueCreateInfos,(value_type *)&device);
  }
  extensions_to_enable.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extensions_to_enable.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  extensions_to_enable.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (this->physical_device).extensions_to_enable.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar11 = (this->physical_device).extensions_to_enable.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1; pbVar11 = pbVar11 + 1
      ) {
    device.device = (VkDevice)(pbVar11->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&extensions_to_enable,
               (char **)&device);
  }
  if (((this->physical_device).surface != (VkSurfaceKHR)0x0) ||
     ((this->physical_device).defer_surface_initialization == true)) {
    device.device = (VkDevice)anon_var_dwarf_31ca1;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&extensions_to_enable,
               (char **)&device);
  }
  final_pnext_chain.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  final_pnext_chain.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  final_pnext_chain.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  device_create_info.enabledExtensionCount = 0;
  device_create_info._52_4_ = 0;
  device_create_info.ppEnabledExtensionNames = (char **)0x0;
  device_create_info.enabledLayerCount = 0;
  device_create_info._36_4_ = 0;
  device_create_info.ppEnabledLayerNames = (char **)0x0;
  device_create_info.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  device_create_info.flags = 0;
  device_create_info.queueCreateInfoCount = 0;
  device_create_info.pQueueCreateInfos = (VkDeviceQueueCreateInfo *)0x0;
  device_create_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  device_create_info._4_4_ = 0;
  device_create_info.pNext = (void *)0x0;
  ppVVar9 = (this->info).pNext_chain.
            super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVVar5 = (this->info).pNext_chain.
            super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppVVar8 = ppVVar5;
    if (ppVVar8 == ppVVar9) goto LAB_001062df;
    ppVVar5 = ppVVar8 + 1;
  } while ((*ppVVar8)->sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2);
  if ((this->physical_device).extended_features_chain.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->physical_device).extended_features_chain.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001062df:
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::vector(&physical_device_extension_features_copy.nodes,
             &(this->physical_device).extended_features_chain.nodes);
    memset(&local_features2,0,0xf0);
    local_features2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    __src = &(this->physical_device).features;
    memcpy(&local_features2.features,__src,0xdc);
    pVVar6 = device_create_info.pEnabledFeatures;
    if ((ppVVar8 == ppVVar9) &&
       ((0x400fff < (this->physical_device).instance_version ||
        (pVVar6 = __src, (this->physical_device).properties2_ext_enabled == true)))) {
      device.device = (VkDevice)&local_features2;
      std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
      emplace_back<VkBaseOutStructure*>
                ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)
                 &final_pnext_chain,(VkBaseOutStructure **)&device);
      for (; pVVar6 = device_create_info.pEnabledFeatures,
          physical_device_extension_features_copy.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          physical_device_extension_features_copy.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_finish;
          physical_device_extension_features_copy.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start =
               physical_device_extension_features_copy.nodes.
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        device.device =
             (VkDevice)
             physical_device_extension_features_copy.nodes.
             super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)
                   &final_pnext_chain,(VkBaseOutStructure **)&device);
      }
    }
    device_create_info.pEnabledFeatures = pVVar6;
    ppVVar2 = (this->info).pNext_chain.
              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (__x = (this->info).pNext_chain.
               super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
               _M_impl.super__Vector_impl_data._M_start; __x != ppVVar2; __x = __x + 1) {
      std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::push_back
                (&final_pnext_chain,__x);
    }
    detail::setup_pNext_chain<VkDeviceCreateInfo>(&device_create_info,&final_pnext_chain);
    ppVVar9 = final_pnext_chain.
              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while (ppVVar9 !=
           final_pnext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      pVVar3 = *ppVVar9;
      ppVVar9 = ppVVar9 + 1;
      if (pVVar3->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                      "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                      ,0x6a4,"Result<Device> vkb::DeviceBuilder::build() const");
      }
    }
    device_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    device_create_info.queueCreateInfoCount =
         (uint32_t)
         (((long)queueCreateInfos.
                 super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)queueCreateInfos.
                super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    device_create_info.flags = (this->info).flags;
    device_create_info.pQueueCreateInfos =
         queueCreateInfos.
         super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    device_create_info.enabledExtensionCount =
         (uint32_t)
         ((ulong)((long)extensions_to_enable.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)extensions_to_enable.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3);
    device_create_info.ppEnabledExtensionNames =
         extensions_to_enable.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    Device::Device(&device);
    VVar7 = (*(code *)detail::vulkan_functions()::v._184_8_)
                      ((this->physical_device).physical_device,&device_create_info,
                       (this->info).allocation_callbacks,&device);
    if (VVar7 == VK_SUCCESS) {
      PhysicalDevice::operator=(&device.physical_device,&this->physical_device);
      device.surface = (this->physical_device).surface;
      std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                (&device.queue_families,&(this->physical_device).queue_families);
      device.allocation_callbacks = (this->info).allocation_callbacks;
      device.fp_vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)detail::vulkan_functions()::v._192_8_
      ;
      device.internal_table.fp_vkGetDeviceQueue =
           (PFN_vkGetDeviceQueue)
           (*(code *)detail::vulkan_functions()::v._192_8_)(device.device,"vkGetDeviceQueue");
      device.internal_table.fp_vkDestroyDevice =
           (PFN_vkDestroyDevice)
           (*(code *)detail::vulkan_functions()::v._192_8_)(device.device,"vkDestroyDevice");
      device.instance_version = (this->physical_device).instance_version;
      Result<vkb::Device>::Result(__return_storage_ptr__,&device);
    }
    else {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
      (__return_storage_ptr__->field_0).m_value.physical_device.name._M_dataplus._M_p =
           (pointer)&detail::device_error_category;
      (__return_storage_ptr__->field_0).m_error.vk_result = VVar7;
      __return_storage_ptr__->m_init = false;
    }
    Device::~Device(&device);
    std::
    _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::~_Vector_base((_Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                     *)&physical_device_extension_features_copy);
  }
  else {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    (__return_storage_ptr__->field_0).m_value.physical_device.name._M_dataplus._M_p =
         (pointer)&detail::device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
  }
  std::_Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::~_Vector_base
            (&final_pnext_chain.
              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&extensions_to_enable.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::_Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::
  ~_Vector_base(&queueCreateInfos.
                 super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
               );
  std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::~vector
            (&queue_descriptions);
  return __return_storage_ptr__;
}

Assistant:

Result<Device> DeviceBuilder::build() const {

    std::vector<CustomQueueDescription> queue_descriptions;
    queue_descriptions.insert(queue_descriptions.end(), info.queue_descriptions.begin(), info.queue_descriptions.end());

    if (queue_descriptions.empty()) {
        for (uint32_t i = 0; i < physical_device.queue_families.size(); i++) {
            queue_descriptions.emplace_back(i, std::vector<float>{ 1.0f });
        }
    }

    std::vector<VkDeviceQueueCreateInfo> queueCreateInfos;
    for (auto& desc : queue_descriptions) {
        VkDeviceQueueCreateInfo queue_create_info = {};
        queue_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
        queue_create_info.queueFamilyIndex = desc.index;
        queue_create_info.queueCount = static_cast<std::uint32_t>(desc.priorities.size());
        queue_create_info.pQueuePriorities = desc.priorities.data();
        queueCreateInfos.push_back(queue_create_info);
    }

    std::vector<const char*> extensions_to_enable;
    for (const auto& ext : physical_device.extensions_to_enable) {
        extensions_to_enable.push_back(ext.c_str());
    }
    if (physical_device.surface != VK_NULL_HANDLE || physical_device.defer_surface_initialization)
        extensions_to_enable.push_back({ VK_KHR_SWAPCHAIN_EXTENSION_NAME });

    std::vector<VkBaseOutStructure*> final_pnext_chain;
    VkDeviceCreateInfo device_create_info = {};

    bool user_defined_phys_dev_features_2 = false;
    for (auto& pnext : info.pNext_chain) {
        if (pnext->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
            user_defined_phys_dev_features_2 = true;
            break;
        }
    }

    if (user_defined_phys_dev_features_2 && !physical_device.extended_features_chain.nodes.empty()) {
        return { DeviceError::VkPhysicalDeviceFeatures2_in_pNext_chain_while_using_add_required_extension_features };
    }

    // These objects must be alive during the call to vkCreateDevice
    auto physical_device_extension_features_copy = physical_device.extended_features_chain;
    VkPhysicalDeviceFeatures2 local_features2{};
    local_features2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    local_features2.features = physical_device.features;

    if (!user_defined_phys_dev_features_2) {
        if (physical_device.instance_version >= VKB_VK_API_VERSION_1_1 || physical_device.properties2_ext_enabled) {
            final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&local_features2));
            for (auto& features_node : physical_device_extension_features_copy.nodes) {
                final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&features_node));
            }
        } else {
            // Only set device_create_info.pEnabledFeatures when the pNext chain does not contain a VkPhysicalDeviceFeatures2 structure
            device_create_info.pEnabledFeatures = &physical_device.features;
        }
    }

    for (auto& pnext : info.pNext_chain) {
        final_pnext_chain.push_back(pnext);
    }

    detail::setup_pNext_chain(device_create_info, final_pnext_chain);
#if !defined(NDEBUG)
    for (auto& node : final_pnext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    device_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    device_create_info.flags = info.flags;
    device_create_info.queueCreateInfoCount = static_cast<uint32_t>(queueCreateInfos.size());
    device_create_info.pQueueCreateInfos = queueCreateInfos.data();
    device_create_info.enabledExtensionCount = static_cast<uint32_t>(extensions_to_enable.size());
    device_create_info.ppEnabledExtensionNames = extensions_to_enable.data();

    Device device;

    VkResult res = detail::vulkan_functions().fp_vkCreateDevice(
        physical_device.physical_device, &device_create_info, info.allocation_callbacks, &device.device);
    if (res != VK_SUCCESS) {
        return { DeviceError::failed_create_device, res };
    }

    device.physical_device = physical_device;
    device.surface = physical_device.surface;
    device.queue_families = physical_device.queue_families;
    device.allocation_callbacks = info.allocation_callbacks;
    device.fp_vkGetDeviceProcAddr = detail::vulkan_functions().fp_vkGetDeviceProcAddr;
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkGetDeviceQueue, "vkGetDeviceQueue");
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkDestroyDevice, "vkDestroyDevice");
    device.instance_version = physical_device.instance_version;
    return device;
}